

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseProtocol.cpp
# Opt level: O3

bool tonk::protocol::DatagramIsTruncated(uint8_t *data,size_t bytes)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = true;
  if (2 < bytes) {
    bVar1 = data[bytes - 3];
    if ((char)bVar1 < '\0') {
      uVar3 = (ulong)(byte)((bVar1 & 3) + (bVar1 >> 2 & 3));
      uVar4 = uVar3 + 6;
      if ((bVar1 & 0x40) != 0) {
        uVar4 = uVar3 + 0x12;
      }
      if (bytes < uVar4) {
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DatagramIsTruncated(const uint8_t* data, size_t bytes)
{
    // If datagram is too short for any valid content:
    if (bytes < kEncryptionTagBytes + kFlagsBytes) {
        return true;
    }

    // Read flags byte
    const uint8_t* footer = data + bytes - kFlagsBytes - kEncryptionTagBytes;
    const FlagsReader flags = footer[0];

    // If the datagram is not large enough to contain the footer:
    if (flags.IsConnectionDatagram() &&
        bytes < flags.ConnectedFooterBytes())
    {
        // This is truncated
        return true;
    }

    // Datagram is large enough to contain valid data
    return false;
}